

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_tt__GetGlyfOffset(nk_tt_fontinfo *info,int glyph_index)

{
  uchar *puVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  iVar3 = -1;
  if ((glyph_index < info->numGlyphs) && (info->indexToLocFormat < 2)) {
    iVar3 = info->loca;
    puVar1 = info->data;
    lVar5 = (long)glyph_index;
    if (info->indexToLocFormat == 0) {
      uVar2 = (uint)puVar1[lVar5 * 2 + (long)iVar3] * 0x200 +
              (uint)puVar1[lVar5 * 2 + (long)iVar3 + 1] * 2;
      uVar4 = (uint)puVar1[lVar5 * 2 + (long)iVar3 + 2] * 0x200 +
              (uint)puVar1[lVar5 * 2 + (long)iVar3 + 3] * 2;
    }
    else {
      uVar2 = *(uint *)(puVar1 + lVar5 * 4 + (long)iVar3);
      uVar4 = *(uint *)(puVar1 + lVar5 * 4 + (long)iVar3 + 4);
      uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    }
    iVar3 = -1;
    if (uVar2 != uVar4) {
      iVar3 = info->glyf + uVar2;
    }
  }
  return iVar3;
}

Assistant:

NK_INTERN int
nk_tt__GetGlyfOffset(const struct nk_tt_fontinfo *info, int glyph_index)
{
    int g1,g2;
    if (glyph_index >= info->numGlyphs) return -1; /* glyph index out of range */
    if (info->indexToLocFormat >= 2)    return -1; /* unknown index->glyph map format */

    if (info->indexToLocFormat == 0) {
        g1 = info->glyf + nk_ttUSHORT(info->data + info->loca + glyph_index * 2) * 2;
        g2 = info->glyf + nk_ttUSHORT(info->data + info->loca + glyph_index * 2 + 2) * 2;
    } else {
        g1 = info->glyf + (int)nk_ttULONG (info->data + info->loca + glyph_index * 4);
        g2 = info->glyf + (int)nk_ttULONG (info->data + info->loca + glyph_index * 4 + 4);
    }
    return g1==g2 ? -1 : g1; /* if length is 0, return -1 */
}